

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::itemHeight(QTreeViewPrivate *this,int item)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  const_reference pQVar4;
  reference pQVar5;
  int *piVar6;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index;
  int height;
  qsizetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_14;
  int in_stack_fffffffffffffff0;
  QTreeView *this_00;
  
  this_00 = *(QTreeView **)(in_FS_OFFSET + 0x28);
  if ((in_RDI->uniformRowHeights & 1U) == 0) {
    bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8f0cb7);
    if (bVar1) {
      local_14 = 0;
    }
    else {
      QList<QTreeViewItem>::at
                ((QList<QTreeViewItem> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (bVar1) {
        pQVar4 = QList<QTreeViewItem>::at
                           ((QList<QTreeViewItem> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        iVar2 = (int)(short)((ulong)*(undefined8 *)&pQVar4->field_0x1c >> 0x30);
        if (iVar2 < 1) {
          q_func(in_RDI);
          uVar3 = QTreeView::indexRowSizeHint
                            (this_00,(QModelIndex *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
          pQVar5 = QList<QTreeViewItem>::operator[]
                             ((QList<QTreeViewItem> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
          *(ulong *)&pQVar5->field_0x1c =
               *(ulong *)&pQVar5->field_0x1c & 0xffffffffffff | (ulong)uVar3 << 0x30;
        }
        piVar6 = qMax<int>((int *)&stack0xfffffffffffffff4,(int *)&stack0xfffffffffffffff0);
        local_14 = *piVar6;
      }
      else {
        local_14 = 0;
      }
    }
  }
  else {
    local_14 = in_RDI->defaultItemHeight;
  }
  if (*(QTreeView **)(in_FS_OFFSET + 0x28) == this_00) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeViewPrivate::itemHeight(int item) const
{
    Q_ASSERT(item < viewItems.size());
    if (uniformRowHeights)
        return defaultItemHeight;
    if (viewItems.isEmpty())
        return 0;
    const QModelIndex &index = viewItems.at(item).index;
    if (!index.isValid())
        return 0;
    int height = viewItems.at(item).height;
    if (height <= 0) {
        height = q_func()->indexRowSizeHint(index);
        viewItems[item].height = height;
    }
    return qMax(height, 0);
}